

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingState<long,long>::
Flush<duckdb::BitpackingCompressionState<long,true,long>::BitpackingWriter>
          (BitpackingState<long,long> *this)

{
  BitpackingState<long,long> *result;
  long *plVar1;
  long *values;
  bool bVar2;
  BitpackingState<long,long> BVar3;
  byte bVar4;
  long lVar5;
  unsigned_long uVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  bool bVar11;
  long left;
  ulong uVar12;
  
  bVar11 = true;
  if (*(idx_t *)(this + 0x8810) == 0) {
    return true;
  }
  if (this[0x8861] == (BitpackingState<long,long>)0x0) {
    lVar5 = *(long *)(this + 0x8828);
    left = *(long *)(this + 0x8830);
    if (left != lVar5) goto LAB_005996af;
  }
  left = *(long *)(this + 0x8830);
  if ((byte)((char)this[0x8864] - 1U) < 2) {
    BitpackingCompressionState<long,_true,_long>::BitpackingWriter::WriteConstant
              (left,*(idx_t *)(this + 0x8810),*(void **)(this + 0x8820),(bool)this[0x8861]);
    *(long *)(this + 0x8818) = *(long *)(this + 0x8818) + 0xc;
    return true;
  }
  lVar5 = *(long *)(this + 0x8828);
LAB_005996af:
  result = this + 0x8838;
  BVar3 = (BitpackingState<long,long>)
          TrySubtractOperator::Operation<long,long,long>(left,lVar5,(int64_t *)result);
  this[0x8863] = BVar3;
  BitpackingState<long,_long>::CalculateDeltaStats((BitpackingState<long,_long> *)this);
  if (this[0x8862] == (BitpackingState<long,long>)0x1) {
    lVar5 = *(long *)(this + 0x8840);
    if ((*(long *)(this + 0x8848) == lVar5) && (((byte)this[0x8864] & 0xfe) != 4)) {
      BitpackingCompressionState<long,_true,_long>::BitpackingWriter::WriteConstantDelta
                (*(long *)(this + 0x8848),**(long **)(this + 0x4008),*(idx_t *)(this + 0x8810),
                 *(long **)(this + 0x4008),(bool *)(this + 0x8010),*(void **)(this + 0x8820));
      *(long *)(this + 0x8818) = *(long *)(this + 0x8818) + 0x14;
      return true;
    }
    if (*(ulong *)(this + 0x8850) == 0) {
      bVar4 = 0;
    }
    else {
      bVar7 = 0;
      uVar12 = *(ulong *)(this + 0x8850);
      do {
        bVar7 = bVar7 + 1;
        bVar2 = 1 < uVar12;
        uVar12 = (long)uVar12 >> 1;
      } while (bVar2);
      bVar4 = 0x40;
      if (bVar7 < 0x39) {
        bVar4 = bVar7;
      }
    }
    uVar12 = *(ulong *)result;
    if (uVar12 == 0) {
      bVar9 = 0;
    }
    else {
      uVar10 = -uVar12;
      if (0 < (long)uVar12) {
        uVar10 = uVar12;
      }
      bVar7 = 0;
      do {
        bVar8 = bVar7;
        bVar7 = bVar8 + 1;
        bVar2 = 1 < uVar10;
        uVar10 = uVar10 >> 1;
      } while (bVar2);
      bVar9 = 0x40;
      if (bVar7 < 0x38) {
        bVar9 = bVar8 + 2;
      }
    }
    if ((bVar4 < bVar9) && (this[0x8864] != (BitpackingState<long,long>)0x5)) {
      if (*(long *)(this + 0x8810) == 0) {
        uVar12 = 0;
      }
      else {
        uVar10 = 0;
        do {
          *(long *)(this + uVar10 * 8 + 0x4010) = *(long *)(this + uVar10 * 8 + 0x4010) - lVar5;
          uVar10 = uVar10 + 1;
          uVar12 = *(ulong *)(this + 0x8810);
        } while (uVar10 < uVar12);
        lVar5 = *(long *)(this + 0x8840);
      }
      BitpackingCompressionState<long,_true,_long>::BitpackingWriter::WriteDeltaFor
                ((long *)(this + 0x4010),(bool *)(this + 0x8010),bVar4,lVar5,
                 *(long *)(this + 0x8858),*(long **)(this + 0x4008),uVar12,*(void **)(this + 0x8820)
                );
      uVar12 = *(ulong *)(this + 0x8810);
      lVar5 = *(long *)(this + 0x8818) + 0x18;
      *(long *)(this + 0x8818) = lVar5;
      if ((uVar12 & 0x1f) != 0) {
        uVar6 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar12 & 0x1f);
        uVar12 = (uVar12 - uVar6) + 0x20;
        lVar5 = *(long *)(this + 0x8818);
      }
      *(ulong *)(this + 0x8818) = (bVar4 * uVar12 >> 3) + lVar5;
      return true;
    }
  }
  if (this[0x8863] == (BitpackingState<long,long>)0x1) {
    if (*(ulong *)result == 0) {
      bVar4 = 0;
    }
    else {
      bVar7 = 0;
      uVar12 = *(ulong *)result;
      do {
        bVar7 = bVar7 + 1;
        bVar2 = 1 < uVar12;
        uVar12 = (long)uVar12 >> 1;
      } while (bVar2);
      bVar4 = 0x40;
      if (bVar7 < 0x39) {
        bVar4 = bVar7;
      }
    }
    values = *(long **)(this + 0x4008);
    lVar5 = *(long *)(this + 0x8828);
    if (*(long *)(this + 0x8810) == 0) {
      uVar12 = 0;
    }
    else {
      uVar10 = 0;
      do {
        plVar1 = values + uVar10;
        *plVar1 = *plVar1 - lVar5;
        uVar10 = uVar10 + 1;
        uVar12 = *(ulong *)(this + 0x8810);
      } while (uVar10 < uVar12);
      lVar5 = *(long *)(this + 0x8828);
    }
    BitpackingCompressionState<long,_true,_long>::BitpackingWriter::WriteFor
              (values,(bool *)(this + 0x8010),bVar4,lVar5,uVar12,*(void **)(this + 0x8820));
    uVar12 = *(ulong *)(this + 0x8810);
    if ((uVar12 & 0x1f) != 0) {
      uVar6 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar12 & 0x1f);
      uVar12 = (uVar12 - uVar6) + 0x20;
    }
    *(ulong *)(this + 0x8818) = *(long *)(this + 0x8818) + (bVar4 * uVar12 >> 3) + 0x10;
  }
  else {
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}